

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O0

int amqpvalue_get_rejected(AMQP_VALUE value,REJECTED_HANDLE *rejected_handle)

{
  int iVar1;
  AMQP_TYPE AVar2;
  AMQP_VALUE pAVar3;
  ERROR_HANDLE local_48;
  ERROR_HANDLE error;
  AMQP_VALUE item_value;
  AMQP_VALUE pAStack_30;
  uint32_t list_item_count;
  AMQP_VALUE list_value;
  REJECTED_INSTANCE *rejected_instance;
  REJECTED_HANDLE *ppRStack_18;
  int result;
  REJECTED_HANDLE *rejected_handle_local;
  AMQP_VALUE value_local;
  
  ppRStack_18 = rejected_handle;
  rejected_handle_local = (REJECTED_HANDLE *)value;
  list_value = (AMQP_VALUE)rejected_create_internal();
  *ppRStack_18 = (REJECTED_HANDLE)list_value;
  if (*ppRStack_18 == (REJECTED_HANDLE)0x0) {
    rejected_instance._4_4_ = 0x455e;
  }
  else {
    pAStack_30 = amqpvalue_get_inplace_described_value((AMQP_VALUE)rejected_handle_local);
    if (pAStack_30 == (AMQP_VALUE)0x0) {
      rejected_destroy(*ppRStack_18);
      rejected_instance._4_4_ = 0x4566;
    }
    else {
      iVar1 = amqpvalue_get_list_item_count(pAStack_30,(uint32_t *)((long)&item_value + 4));
      if (iVar1 == 0) {
        if ((item_value._4_4_ != 0) &&
           (error = (ERROR_HANDLE)amqpvalue_get_list_item(pAStack_30,0),
           (AMQP_VALUE)error != (AMQP_VALUE)0x0)) {
          AVar2 = amqpvalue_get_type((AMQP_VALUE)error);
          if (AVar2 != AMQP_TYPE_NULL) {
            iVar1 = amqpvalue_get_error((AMQP_VALUE)error,&local_48);
            if (iVar1 != 0) {
              amqpvalue_destroy((AMQP_VALUE)error);
              rejected_destroy(*ppRStack_18);
              return 0x4589;
            }
            error_destroy(local_48);
          }
          amqpvalue_destroy((AMQP_VALUE)error);
        }
        pAVar3 = amqpvalue_clone((AMQP_VALUE)rejected_handle_local);
        *(AMQP_VALUE *)list_value = pAVar3;
        rejected_instance._4_4_ = 0;
      }
      else {
        rejected_instance._4_4_ = 0x456d;
      }
    }
  }
  return rejected_instance._4_4_;
}

Assistant:

int amqpvalue_get_rejected(AMQP_VALUE value, REJECTED_HANDLE* rejected_handle)
{
    int result;
    REJECTED_INSTANCE* rejected_instance = (REJECTED_INSTANCE*)rejected_create_internal();
    *rejected_handle = rejected_instance;
    if (*rejected_handle == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        AMQP_VALUE list_value = amqpvalue_get_inplace_described_value(value);
        if (list_value == NULL)
        {
            rejected_destroy(*rejected_handle);
            result = MU_FAILURE;
        }
        else
        {
            uint32_t list_item_count;
            if (amqpvalue_get_list_item_count(list_value, &list_item_count) != 0)
            {
                result = MU_FAILURE;
            }
            else
            {
                do
                {
                    AMQP_VALUE item_value;
                    /* error */
                    if (list_item_count > 0)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 0);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                /* no error, field is not mandatory */
                            }
                            else
                            {
                                ERROR_HANDLE error;
                                if (amqpvalue_get_error(item_value, &error) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    rejected_destroy(*rejected_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                                else
                                {
                                    error_destroy(error);
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }

                    rejected_instance->composite_value = amqpvalue_clone(value);

                    result = 0;
                } while(0);
            }
        }
    }

    return result;
}